

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O3

void __thiscall sf::priv::WindowImplX11::setVisible(WindowImplX11 *this,bool visible)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,visible) == 0) {
    XUnmapWindow(this->m_display,this->m_window);
    XFlush(this->m_display);
    if (this->m_windowMapped == true) {
      do {
        if (this->m_isExternal != false) {
          return;
        }
        (*(this->super_WindowImpl)._vptr_WindowImpl[0x10])(this);
      } while (this->m_windowMapped != false);
    }
  }
  else {
    XMapWindow();
    if (this->m_fullscreen == true) {
      switchToFullscreen(this);
    }
    XFlush(this->m_display);
    while ((this->m_windowMapped == false && (this->m_isExternal == false))) {
      (*(this->super_WindowImpl)._vptr_WindowImpl[0x10])(this);
    }
  }
  return;
}

Assistant:

void WindowImplX11::setVisible(bool visible)
{
    if (visible)
    {
        XMapWindow(m_display, m_window);

        if(m_fullscreen)
            switchToFullscreen();

        XFlush(m_display);

        // Before continuing, make sure the WM has
        // internally marked the window as viewable
        while (!m_windowMapped && !m_isExternal)
            processEvents();
    }
    else
    {
        XUnmapWindow(m_display, m_window);

        XFlush(m_display);

        // Before continuing, make sure the WM has
        // internally marked the window as unviewable
        while (m_windowMapped && !m_isExternal)
            processEvents();
    }
}